

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers_test.cpp
# Opt level: O0

void flatbuffers::tests::FlexBuffersDeprecatedTest(void)

{
  bool expval;
  Type expval_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  uchar *buf;
  size_type_conflict buf_len;
  char *pcVar2;
  char *pcVar3;
  Reference local_188;
  String local_178;
  Reference local_160;
  Reference local_150;
  String local_140;
  Reference local_128;
  Reference local_118;
  undefined1 local_108 [8];
  TypedVector vec;
  size_t start;
  allocator<char> local_c9;
  undefined1 local_c8 [8];
  string test_data;
  Builder slb;
  
  flexbuffers::Builder::Builder
            ((Builder *)((long)&test_data.field_2 + 8),0x100,BUILDER_FLAG_SHARE_KEYS);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,300,'A',&local_c9);
  std::allocator<char>::~allocator(&local_c9);
  vec._24_8_ = flexbuffers::Builder::StartVector((Builder *)((long)&test_data.field_2 + 8));
  flexbuffers::Builder::String((Builder *)((long)&test_data.field_2 + 8),(string *)local_c8);
  flexbuffers::Builder::String((Builder *)((long)&test_data.field_2 + 8),"hello");
  flexbuffers::Builder::EndVector((Builder *)((long)&test_data.field_2 + 8),vec._24_8_,true,false);
  flexbuffers::Builder::Finish((Builder *)((long)&test_data.field_2 + 8));
  pvVar1 = flexbuffers::Builder::GetBuffer((Builder *)((long)&test_data.field_2 + 8));
  buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(pvVar1);
  pvVar1 = flexbuffers::Builder::GetBuffer((Builder *)((long)&test_data.field_2 + 8));
  buf_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar1);
  expval = flexbuffers::VerifyBuffer
                     (buf,buf_len,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  TestEq<bool,bool>(expval,true,
                    "\'flexbuffers::VerifyBuffer(slb.GetBuffer().data(), slb.GetBuffer().size(), nullptr)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
                    ,0xe8,"");
  pvVar1 = flexbuffers::Builder::GetBuffer((Builder *)((long)&test_data.field_2 + 8));
  local_118 = flexbuffers::GetRoot(pvVar1);
  flexbuffers::Reference::AsTypedVector((TypedVector *)local_108,&local_118);
  expval_00 = flexbuffers::TypedVector::ElementType((TypedVector *)local_108);
  TestEq<flexbuffers::Type,flexbuffers::Type>
            (expval_00,FBT_KEY,"\'vec.ElementType()\' != \'flexbuffers::FBT_KEY\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
             ,0xf3,"");
  local_128 = flexbuffers::TypedVector::operator[]((TypedVector *)local_108,0);
  pcVar2 = flexbuffers::Reference::AsKey(&local_128);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar2,pcVar3,"\'vec[0].AsKey()\' != \'test_data.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xf7,"");
  local_150 = flexbuffers::TypedVector::operator[]((TypedVector *)local_108,0);
  flexbuffers::Reference::AsString(&local_140,&local_150);
  pcVar2 = flexbuffers::String::c_str(&local_140);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  TestEqStr(pcVar2,pcVar3,"\'vec[0].AsString().c_str()\' != \'test_data.c_str()\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xfa,"");
  local_160 = flexbuffers::TypedVector::operator[]((TypedVector *)local_108,1);
  pcVar2 = flexbuffers::Reference::AsKey(&local_160);
  TestEqStr(pcVar2,"hello","\'vec[1].AsKey()\' != \'\"hello\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xfc,"");
  local_188 = flexbuffers::TypedVector::operator[]((TypedVector *)local_108,1);
  flexbuffers::Reference::AsString(&local_178,&local_188);
  pcVar2 = flexbuffers::String::c_str(&local_178);
  TestEqStr(pcVar2,"hello","\'vec[1].AsString().c_str()\' != \'\"hello\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/flexbuffers_test.cpp"
            ,0xfd,"");
  std::__cxx11::string::~string((string *)local_c8);
  flexbuffers::Builder::~Builder((Builder *)((long)&test_data.field_2 + 8));
  return;
}

Assistant:

void FlexBuffersDeprecatedTest() {
  // FlexBuffers as originally designed had a flaw involving the
  // FBT_VECTOR_STRING datatype, and this test documents/tests the fix for it.
  // Discussion: https://github.com/google/flatbuffers/issues/5627
  flexbuffers::Builder slb;
  // FBT_VECTOR_* are "typed vectors" where all elements are of the same type.
  // Problem is, when storing FBT_STRING elements, it relies on that type to
  // get the bit-width for the size field of the string, which in this case
  // isn't present, and instead defaults to 8-bit. This means that any strings
  // stored inside such a vector, when accessed thru the old API that returns
  // a String reference, will appear to be truncated if the string stored is
  // actually >=256 bytes.
  std::string test_data(300, 'A');
  auto start = slb.StartVector();
  // This one will have a 16-bit size field.
  slb.String(test_data);
  // This one will have an 8-bit size field.
  slb.String("hello");
  // We're asking this to be serialized as a typed vector (true), but not
  // fixed size (false). The type will be FBT_VECTOR_STRING with a bit-width
  // of whatever the offsets in the vector need, the bit-widths of the strings
  // are not stored(!) <- the actual design flaw.
  // Note that even in the fixed code, we continue to serialize the elements of
  // FBT_VECTOR_STRING as FBT_STRING, since there may be old code out there
  // reading new data that we want to continue to function.
  // Thus, FBT_VECTOR_STRING, while deprecated, will always be represented the
  // same way, the fix lies on the reading side.
  slb.EndVector(start, true, false);
  slb.Finish();
  // Verify because why not.
  TEST_EQ(flexbuffers::VerifyBuffer(slb.GetBuffer().data(),
                                    slb.GetBuffer().size(), nullptr),
          true);
  // So now lets read this data back.
  // For existing data, since we have no way of knowing what the actual
  // bit-width of the size field of the string is, we are going to ignore this
  // field, and instead treat these strings as FBT_KEY (null-terminated), so we
  // can deal with strings of arbitrary length. This of course truncates strings
  // with embedded nulls, but we think that that is preferrable over truncating
  // strings >= 256 bytes.
  auto vec = flexbuffers::GetRoot(slb.GetBuffer()).AsTypedVector();
  // Even though this was serialized as FBT_VECTOR_STRING, it is read as
  // FBT_VECTOR_KEY:
  TEST_EQ(vec.ElementType(), flexbuffers::FBT_KEY);
  // Access the long string. Previously, this would return a string of size 1,
  // since it would read the high-byte of the 16-bit length.
  // This should now correctly test the full 300 bytes, using AsKey():
  TEST_EQ_STR(vec[0].AsKey(), test_data.c_str());
  // Old code that called AsString will continue to work, as the String
  // accessor objects now use a cached size that can come from a key as well.
  TEST_EQ_STR(vec[0].AsString().c_str(), test_data.c_str());
  // Short strings work as before:
  TEST_EQ_STR(vec[1].AsKey(), "hello");
  TEST_EQ_STR(vec[1].AsString().c_str(), "hello");
  // So, while existing code and data mostly "just work" with the fixes applied
  // to AsTypedVector and AsString, what do you do going forward?
  // Code accessing existing data doesn't necessarily need to change, though
  // you could consider using AsKey instead of AsString for a) documenting
  // that you are accessing keys, or b) a speedup if you don't actually use
  // the string size.
  // For new data, or data that doesn't need to be backwards compatible,
  // instead serialize as FBT_VECTOR (call EndVector with typed = false, then
  // read elements with AsString), or, for maximum compactness, use
  // FBT_VECTOR_KEY (call slb.Key above instead, read with AsKey or AsString).
}